

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Buff * __thiscall Buff::operator=(Buff *this,Buff *rhs)

{
  int local_1c;
  int i;
  Buff *rhs_local;
  Buff *this_local;
  
  for (local_1c = 0; local_1c < 0x800; local_1c = local_1c + 1) {
    this->_buf[local_1c] = rhs->_buf[local_1c];
  }
  this->_r_pos = (char *)((long)this + ((long)rhs->_r_pos - (long)rhs));
  this->_w_pos = (char *)((long)this + ((long)rhs->_w_pos - (long)rhs));
  return this;
}

Assistant:

Buff& operator=(const Buff& rhs) {
        for (int i = 0; i < LINE_MAX; ++i)
        {
            _buf[i] = rhs._buf[i];
        }

        _r_pos = _buf + (rhs._r_pos - rhs._buf);
        _w_pos = _buf + (rhs._w_pos - rhs._buf);
        return *this;
    }